

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGridHeader.cpp
# Opt level: O2

void PatternGridHeaderTU::drawMinus(QPainter *painter,int xpos,QColor *color)

{
  QPainter::fillRect(painter,xpos + 2,0x1b,8,2,color);
  return;
}

Assistant:

void drawMinus(QPainter &painter, int xpos, QColor const& color) {
    painter.fillRect(
        xpos + PM_VPAD, 
        MINUS_START_Y + PM_HPAD + PM_CENTER,
        PM_LENGTH,
        PM_THICKNESS,
        color
    );
}